

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  byte c;
  byte bVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  size_t n;
  ulong uVar8;
  size_type index;
  bool bVar9;
  ulong local_50;
  
  index = 0;
  do {
    if ((this->m_str).m_size <= index) {
      return;
    }
    c = StringRef::operator[](&this->m_str,index);
    uVar3 = index;
    if (c == 0x22) {
      if (this->m_forWhat == ForAttributes) {
        pcVar6 = "&quot;";
        goto LAB_0015a18b;
      }
      c = 0x22;
LAB_0015a1c2:
      std::operator<<(os,c);
    }
    else {
      if (c == 0x26) {
        pcVar6 = "&amp;";
      }
      else if (c == 0x3e) {
        if (((index < 3) || (cVar2 = StringRef::operator[](&this->m_str,index - 1), cVar2 != ']'))
           || (cVar2 = StringRef::operator[](&this->m_str,index - 2), cVar2 != ']')) {
          c = 0x3e;
          goto LAB_0015a1c2;
        }
        pcVar6 = "&gt;";
      }
      else {
        uVar7 = (uint)c;
        if (uVar7 != 0x3c) {
          if ((8 < c) && (c != 0x7f && 0x11 < (byte)(c - 0xe))) {
            if (c < 0x7f) goto LAB_0015a1c2;
            if (199 < (byte)(c + 8)) {
              uVar5 = uVar7 & 0xffffffe0;
              local_50 = (ulong)((uVar7 & 0xfffffff0) != 0xe0) + 3;
              if (uVar5 == 0xc0) {
                local_50 = 2;
              }
              uVar3 = (index + local_50) - 1;
              if (uVar3 < (this->m_str).m_size) {
                uVar4 = (uint)((uVar7 & 0xfffffff0) == 0xe0) * 8 + 7;
                if (uVar5 == 0xc0) {
                  uVar4 = 0x1f;
                }
                uVar4 = uVar4 & uVar7;
                bVar9 = true;
                for (uVar8 = 1; uVar8 < local_50; uVar8 = uVar8 + 1) {
                  bVar1 = StringRef::operator[](&this->m_str,index + uVar8);
                  bVar9 = (bool)(bVar9 & (bVar1 & 0xffffffc0) == 0x80);
                  uVar4 = uVar4 << 6 | bVar1 & 0x3f;
                }
                if (((bVar9) && (0x7f < uVar4)) &&
                   ((uVar5 == 0xc0 || 0x7ff < uVar4 &&
                    (((uint)local_50 < 4 || 0xf7fe < uVar4 - 0x801 && (uVar4 < 0x110000)))))) {
                  while (bVar9 = local_50 != 0, local_50 = local_50 - 1, bVar9) {
                    cVar2 = StringRef::operator[](&this->m_str,index);
                    std::operator<<(os,cVar2);
                    index = index + 1;
                  }
                }
                else {
                  anon_unknown_26::hexEscapeChar(os,c);
                  uVar3 = index;
                }
                goto LAB_0015a1c7;
              }
            }
          }
          anon_unknown_26::hexEscapeChar(os,c);
          uVar3 = index;
          goto LAB_0015a1c7;
        }
        pcVar6 = "&lt;";
      }
LAB_0015a18b:
      std::operator<<(os,pcVar6);
    }
LAB_0015a1c7:
    index = uVar3 + 1;
  } while( true );
}

Assistant:

void XmlEncode::encodeTo( std::ostream& os ) const {
        // Apostrophe escaping not necessary if we always use " to write attributes
        // (see: http://www.w3.org/TR/xml/#syntax)

        for( std::size_t idx = 0; idx < m_str.size(); ++ idx ) {
            unsigned char c = static_cast<unsigned char>(m_str[idx]);
            switch (c) {
            case '<':   os << "&lt;"; break;
            case '&':   os << "&amp;"; break;

            case '>':
                // See: http://www.w3.org/TR/xml/#syntax
                if (idx > 2 && m_str[idx - 1] == ']' && m_str[idx - 2] == ']')
                    os << "&gt;";
                else
                    os << c;
                break;

            case '\"':
                if (m_forWhat == ForAttributes)
                    os << "&quot;";
                else
                    os << c;
                break;

            default:
                // Check for control characters and invalid utf-8

                // Escape control characters in standard ascii
                // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                if (c < 0x09 || (c > 0x0D && c < 0x20) || c == 0x7F) {
                    hexEscapeChar(os, c);
                    break;
                }

                // Plain ASCII: Write it to stream
                if (c < 0x7F) {
                    os << c;
                    break;
                }

                // UTF-8 territory
                // Check if the encoding is valid and if it is not, hex escape bytes.
                // Important: We do not check the exact decoded values for validity, only the encoding format
                // First check that this bytes is a valid lead byte:
                // This means that it is not encoded as 1111 1XXX
                // Or as 10XX XXXX
                if (c <  0xC0 ||
                    c >= 0xF8) {
                    hexEscapeChar(os, c);
                    break;
                }

                auto encBytes = trailingBytes(c);
                // Are there enough bytes left to avoid accessing out-of-bounds memory?
                if (idx + encBytes - 1 >= m_str.size()) {
                    hexEscapeChar(os, c);
                    break;
                }
                // The header is valid, check data
                // The next encBytes bytes must together be a valid utf-8
                // This means: bitpattern 10XX XXXX and the extracted value is sane (ish)
                bool valid = true;
                uint32_t value = headerValue(c);
                for (std::size_t n = 1; n < encBytes; ++n) {
                    unsigned char nc = static_cast<unsigned char>(m_str[idx + n]);
                    valid &= ((nc & 0xC0) == 0x80);
                    value = (value << 6) | (nc & 0x3F);
                }

                if (
                    // Wrong bit pattern of following bytes
                    (!valid) ||
                    // Overlong encodings
                    (value < 0x80) ||
                    (0x80 <= value && value < 0x800   && encBytes > 2) ||
                    (0x800 < value && value < 0x10000 && encBytes > 3) ||
                    // Encoded value out of range
                    (value >= 0x110000)
                    ) {
                    hexEscapeChar(os, c);
                    break;
                }

                // If we got here, this is in fact a valid(ish) utf-8 sequence
                for (std::size_t n = 0; n < encBytes; ++n) {
                    os << m_str[idx + n];
                }
                idx += encBytes - 1;
                break;
            }
        }
    }